

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall
wasm::PassRunner::doAdd
          (PassRunner *this,unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass)

{
  bool bVar1;
  uint uVar2;
  pointer pPVar3;
  ostream *poVar4;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass_local;
  PassRunner *this_local;
  
  pPVar3 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->(pass);
  uVar2 = (*pPVar3->_vptr_Pass[7])();
  if (((uVar2 & 1) != 0) && (bVar1 = shouldPreserveDWARF(this), bVar1)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"warning: running pass \'");
    pPVar3 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->(pass);
    poVar4 = std::operator<<(poVar4,(string *)&pPVar3->name);
    std::operator<<(poVar4,"\' which is not fully compatible with DWARF\n");
  }
  pPVar3 = std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::operator->(pass);
  bVar1 = passRemovesDebugInfo(&pPVar3->name);
  if (bVar1) {
    this->addedPassesRemovedDWARF = true;
  }
  std::
  vector<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>,std::allocator<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>>>
  ::emplace_back<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>>
            ((vector<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>,std::allocator<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>>>
              *)&this->passes,pass);
  return;
}

Assistant:

void PassRunner::doAdd(std::unique_ptr<Pass> pass) {
  if (pass->invalidatesDWARF() && shouldPreserveDWARF()) {
    std::cerr << "warning: running pass '" << pass->name
              << "' which is not fully compatible with DWARF\n";
  }
  if (passRemovesDebugInfo(pass->name)) {
    addedPassesRemovedDWARF = true;
  }
  passes.emplace_back(std::move(pass));
}